

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O1

FT_Error cff_subfont_load(CFF_SubFont subfont,CFF_Index idx,FT_UInt font_index,FT_Stream stream,
                         FT_ULong base_offset,FT_UInt code,CFF_Font_conflict font,CFF_Face face)

{
  FT_UInt32 FVar1;
  void *pvVar2;
  FT_Driver pFVar3;
  FT_ULong FVar4;
  FT_ULong FVar5;
  FT_Stream stream_00;
  CFF_Index pCVar6;
  FT_Error FVar7;
  int iVar8;
  FT_Byte *limit;
  FT_Stream stream_01;
  FT_UInt FVar9;
  bool cff2;
  FT_ULong dict_len;
  CFF_ParserRec parser;
  FT_Byte *local_a8;
  void *local_a0;
  FT_ULong local_98;
  FT_ULong local_90;
  FT_Stream local_88;
  CFF_Index local_80;
  CFF_ParserRec_ local_78;
  
  local_a8 = (FT_Byte *)0x0;
  pvVar2 = face->psaux;
  cff2 = (code - 0x3000 & 0xffffefff) == 0;
  FVar9 = 0x60;
  if (cff2) {
    FVar9 = 0x201;
  }
  local_90 = base_offset;
  local_88 = stream;
  local_80 = idx;
  FVar7 = cff_parser_init(&local_78,code,subfont,font->library,FVar9,0,0);
  stream_00 = local_88;
  if (FVar7 != 0) goto LAB_00228136;
  local_a0 = pvVar2;
  memset(subfont,0,0x148);
  pCVar6 = local_80;
  (subfont->font_dict).underline_position = -0x640000;
  (subfont->font_dict).underline_thickness = 0x320000;
  (subfont->font_dict).charstring_type = 2;
  (subfont->font_dict).font_matrix.xx = 0x10000;
  (subfont->font_dict).font_matrix.yy = 0x10000;
  (subfont->font_dict).cid_count = 0x2210;
  (subfont->font_dict).version = 0xffff;
  (subfont->font_dict).notice = 0xffff;
  (subfont->font_dict).copyright = 0xffff;
  (subfont->font_dict).full_name = 0xffff;
  (subfont->font_dict).family_name = 0xffff;
  (subfont->font_dict).weight = 0xffff;
  (subfont->font_dict).embedded_postscript = 0xffff;
  (subfont->font_dict).cid_registry = 0xffff;
  FVar9 = 0x30;
  if (cff2) {
    FVar9 = 0x201;
  }
  (subfont->font_dict).cid_ordering = 0xffff;
  (subfont->font_dict).cid_font_name = 0xffff;
  (subfont->font_dict).maxstack = FVar9;
  if (local_80->count == 0) {
    FVar7 = FT_Stream_Seek(stream_00,local_80->data_offset);
    if ((FVar7 != 0) ||
       (FVar7 = FT_Stream_ExtractFrame(stream_00,pCVar6->data_size,&local_a8), FVar7 != 0))
    goto LAB_00228136;
    local_98 = pCVar6->data_size;
    FVar7 = 0;
  }
  else {
    FVar7 = cff_index_access_element(local_80,font_index,&local_a8,&local_98);
  }
  if (FVar7 == 0) {
    limit = local_a8 + local_98;
    if (local_a8 == (FT_Byte *)0x0) {
      limit = (FT_Byte *)0x0;
    }
    FVar7 = cff_parser_run(&local_78,local_a8,limit);
  }
  stream_01 = stream_00;
  if (pCVar6->count == 0) {
LAB_00228259:
    FT_Stream_ReleaseFrame(stream_01,&local_a8);
  }
  else if (pCVar6->bytes == (FT_Byte *)0x0) {
    stream_01 = pCVar6->stream;
    goto LAB_00228259;
  }
  if (FVar7 != 0) goto LAB_00228136;
  if ((subfont->font_dict).cid_registry == 0xffff) {
    FVar7 = cff_load_private_dict(font,subfont,0,(FT_Fixed *)0x0);
    FVar5 = local_90;
    pvVar2 = local_a0;
    if (FVar7 != 0) goto LAB_00228136;
    if ((code != 0x3000) && (code != 0x4000)) {
      FVar1 = ((face->root).internal)->random_seed;
      if (FVar1 == 0xffffffff) {
        pFVar3 = (face->root).driver;
        FVar1 = *(FT_UInt32 *)&pFVar3[1].faces_list.tail;
        subfont->random = FVar1;
        if (FVar1 != 0) {
          do {
            iVar8 = (**(code **)((long)pvVar2 + 0x28))(*(undefined4 *)&pFVar3[1].faces_list.tail);
            *(int *)&pFVar3[1].faces_list.tail = iVar8;
          } while (iVar8 < 0);
        }
      }
      else {
        subfont->random = FVar1;
        if (FVar1 != 0) {
          do {
            iVar8 = (**(code **)((long)pvVar2 + 0x28))(((face->root).internal)->random_seed);
            ((face->root).internal)->random_seed = iVar8;
          } while (iVar8 < 0);
        }
      }
      if (subfont->random == 0) {
        subfont->random = (FT_UInt32)(subfont->private_dict).initial_random_seed;
      }
    }
    FVar4 = (subfont->private_dict).local_subrs_offset;
    if (FVar4 != 0) {
      FVar7 = FT_Stream_Seek(stream_00,FVar4 + FVar5 + (subfont->font_dict).private_offset);
      if (FVar7 == 0) {
        FVar7 = cff_index_init(&subfont->local_subrs_index,stream_00,'\x01',cff2);
        if (FVar7 == 0) {
          FVar7 = cff_index_get_pointers
                            (&subfont->local_subrs_index,&subfont->local_subrs,(FT_Byte **)0x0,
                             (FT_ULong *)0x0);
        }
      }
      goto LAB_00228136;
    }
  }
  FVar7 = 0;
LAB_00228136:
  ft_mem_free((local_78.library)->memory,local_78.stack);
  return FVar7;
}

Assistant:

static FT_Error
  cff_subfont_load( CFF_SubFont  subfont,
                    CFF_Index    idx,
                    FT_UInt      font_index,
                    FT_Stream    stream,
                    FT_ULong     base_offset,
                    FT_UInt      code,
                    CFF_Font     font,
                    CFF_Face     face )
  {
    FT_Error         error;
    CFF_ParserRec    parser;
    FT_Byte*         dict = NULL;
    FT_ULong         dict_len;
    CFF_FontRecDict  top  = &subfont->font_dict;
    CFF_Private      priv = &subfont->private_dict;

    PSAux_Service  psaux = (PSAux_Service)face->psaux;

    FT_Bool  cff2      = FT_BOOL( code == CFF2_CODE_TOPDICT  ||
                                  code == CFF2_CODE_FONTDICT );
    FT_UInt  stackSize = cff2 ? CFF2_DEFAULT_STACK
                              : CFF_MAX_STACK_DEPTH;


    /* Note: We use default stack size for CFF2 Font DICT because        */
    /*       Top and Font DICTs are not allowed to have blend operators. */
    error = cff_parser_init( &parser,
                             code,
                             &subfont->font_dict,
                             font->library,
                             stackSize,
                             0,
                             0 );
    if ( error )
      goto Exit;

    /* set defaults */
    FT_ZERO( top );

    top->underline_position  = -( 100L << 16 );
    top->underline_thickness = 50L << 16;
    top->charstring_type     = 2;
    top->font_matrix.xx      = 0x10000L;
    top->font_matrix.yy      = 0x10000L;
    top->cid_count           = 8720;

    /* we use the implementation specific SID value 0xFFFF to indicate */
    /* missing entries                                                 */
    top->version             = 0xFFFFU;
    top->notice              = 0xFFFFU;
    top->copyright           = 0xFFFFU;
    top->full_name           = 0xFFFFU;
    top->family_name         = 0xFFFFU;
    top->weight              = 0xFFFFU;
    top->embedded_postscript = 0xFFFFU;

    top->cid_registry        = 0xFFFFU;
    top->cid_ordering        = 0xFFFFU;
    top->cid_font_name       = 0xFFFFU;

    /* set default stack size */
    top->maxstack            = cff2 ? CFF2_DEFAULT_STACK : 48;

    if ( idx->count )   /* count is nonzero for a real index */
      error = cff_index_access_element( idx, font_index, &dict, &dict_len );
    else
    {
      /* CFF2 has a fake top dict index;     */
      /* simulate `cff_index_access_element' */

      /* Note: macros implicitly use `stream' and set `error' */
      if ( FT_STREAM_SEEK( idx->data_offset )       ||
           FT_FRAME_EXTRACT( idx->data_size, dict ) )
        goto Exit;

      dict_len = idx->data_size;
    }

    if ( !error )
    {
      FT_TRACE4(( " top dictionary:\n" ));
      error = cff_parser_run( &parser, dict, FT_OFFSET( dict, dict_len ) );
    }

    /* clean up regardless of error */
    if ( idx->count )
      cff_index_forget_element( idx, &dict );
    else
      FT_FRAME_RELEASE( dict );

    if ( error )
      goto Exit;

    /* if it is a CID font, we stop there */
    if ( top->cid_registry != 0xFFFFU )
      goto Exit;

    /* Parse the private dictionary, if any.                   */
    /*                                                         */
    /* CFF2 does not have a private dictionary in the Top DICT */
    /* but may have one in a Font DICT.  We need to parse      */
    /* the latter here in order to load any local subrs.       */
    error = cff_load_private_dict( font, subfont, 0, 0 );
    if ( error )
      goto Exit;

    if ( !cff2 )
    {
      /*
       * Initialize the random number generator.
       *
       * - If we have a face-specific seed, use it.
       *   If non-zero, update it to a positive value.
       *
       * - Otherwise, use the seed from the CFF driver.
       *   If non-zero, update it to a positive value.
       *
       * - If the random value is zero, use the seed given by the subfont's
       *   `initialRandomSeed' value.
       *
       */
      if ( face->root.internal->random_seed == -1 )
      {
        PS_Driver  driver = (PS_Driver)FT_FACE_DRIVER( face );


        subfont->random = (FT_UInt32)driver->random_seed;
        if ( driver->random_seed )
        {
          do
          {
            driver->random_seed =
              (FT_Int32)psaux->cff_random( (FT_UInt32)driver->random_seed );

          } while ( driver->random_seed < 0 );
        }
      }
      else
      {
        subfont->random = (FT_UInt32)face->root.internal->random_seed;
        if ( face->root.internal->random_seed )
        {
          do
          {
            face->root.internal->random_seed =
              (FT_Int32)psaux->cff_random(
                (FT_UInt32)face->root.internal->random_seed );

          } while ( face->root.internal->random_seed < 0 );
        }
      }

      if ( !subfont->random )
        subfont->random = (FT_UInt32)priv->initial_random_seed;
    }

    /* read the local subrs, if any */
    if ( priv->local_subrs_offset )
    {
      if ( FT_STREAM_SEEK( base_offset + top->private_offset +
                           priv->local_subrs_offset ) )
        goto Exit;

      error = cff_index_init( &subfont->local_subrs_index, stream, 1, cff2 );
      if ( error )
        goto Exit;

      error = cff_index_get_pointers( &subfont->local_subrs_index,
                                      &subfont->local_subrs, NULL, NULL );
      if ( error )
        goto Exit;
    }

  Exit:
    cff_parser_done( &parser ); /* free parser stack */

    return error;
  }